

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

Var Js::JavascriptArray::ReduceHelper<unsigned_long>
              (JavascriptArray *pArr,TypedArrayBase *typedArrayBase,RecyclableObject *obj,
              unsigned_long length,Arguments *args,ScriptContext *scriptContext)

{
  ulong uVar1;
  code *pcVar2;
  Var pvVar3;
  Var pvVar4;
  Var pvVar5;
  bool bVar6;
  BOOL BVar7;
  uint32 uVar8;
  int iVar9;
  ThreadContext *pTVar10;
  Var pvVar11;
  undefined4 extraout_var;
  undefined4 *puVar12;
  JavascriptLibrary *this;
  RecyclableObject *pRVar13;
  unsigned_long *puVar14;
  undefined4 extraout_var_00;
  JavascriptMethod p_Var15;
  Var pvVar16;
  CallInfo local_f0;
  CallInfo local_e8;
  undefined1 local_e0 [8];
  AutoReentrancyHandler autoReentrancyHandler;
  uint32 end_1;
  Var undefinedValue;
  ulong uStack_b0;
  BOOL hasItem;
  uint local_a8;
  byte local_a1;
  uint32 end;
  bool bPresent;
  Var element;
  Var accumulator;
  RecyclableObject *callBackFn;
  unsigned_long k;
  undefined1 local_70 [8];
  JsReentLock jsReentLock;
  ScriptContext *scriptContext_local;
  Arguments *args_local;
  unsigned_long length_local;
  RecyclableObject *obj_local;
  TypedArrayBase *typedArrayBase_local;
  JavascriptArray *pArr_local;
  
  jsReentLock._24_8_ = scriptContext;
  args_local = (Arguments *)length;
  length_local = (unsigned_long)obj;
  obj_local = (RecyclableObject *)typedArrayBase;
  typedArrayBase_local = (TypedArrayBase *)pArr;
  pTVar10 = ScriptContext::GetThreadContext(scriptContext);
  JsReentLock::JsReentLock((JsReentLock *)local_70,pTVar10);
  JsReentLock::setObjectForMutation((JsReentLock *)local_70,typedArrayBase_local);
  if (1 < (SUB84(args->Info,0) & 0xffffff)) {
    pvVar11 = Arguments::operator[](args,1);
    bVar6 = JavascriptConversion::IsCallable(pvVar11);
    if (bVar6) {
      if (((obj_local == (RecyclableObject *)0x0) && (typedArrayBase_local == (TypedArrayBase *)0x0)
          ) && (bVar6 = VarIs<Js::TypedArrayBase,Js::RecyclableObject>
                                  ((RecyclableObject *)length_local), bVar6)) {
        obj_local = (RecyclableObject *)
                    UnsafeVarTo<Js::TypedArrayBase,Js::RecyclableObject>
                              ((RecyclableObject *)length_local);
      }
      callBackFn = (RecyclableObject *)0x0;
      pvVar11 = Arguments::operator[](args,1);
      accumulator = VarTo<Js::RecyclableObject>(pvVar11);
      element = (Var)0x0;
      _end = (Var)0x0;
      if ((SUB84(args->Info,0) & 0xffffff) < 3) {
        if (args_local == (Arguments *)0x0) {
          if (obj_local != (RecyclableObject *)0x0) {
            JavascriptError::ThrowTypeError
                      ((ScriptContext *)jsReentLock._24_8_,-0x7ff5ea0b,
                       L"TypedArray.prototype.reduce");
          }
          JavascriptError::ThrowTypeError
                    ((ScriptContext *)jsReentLock._24_8_,-0x7ff5ea0b,L"Array.prototype.reduce");
        }
        local_a1 = 0;
        if (obj_local == (RecyclableObject *)0x0) {
          for (; callBackFn < args_local && (local_a1 & 1) == 0;
              callBackFn = (RecyclableObject *)
                           ((long)&(callBackFn->super_FinalizableObject).
                                   super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject + 1)) {
            JsReentLock::unlock((JsReentLock *)local_70);
            BVar7 = Js::JavascriptOperators::HasItem
                              ((RecyclableObject *)length_local,(uint64)callBackFn);
            JsReentLock::MutateArrayObject((JsReentLock *)local_70);
            JsReentLock::relock((JsReentLock *)local_70);
            if (BVar7 != 0) {
              JsReentLock::unlock((JsReentLock *)local_70);
              element = Js::JavascriptOperators::GetItem
                                  ((RecyclableObject *)length_local,(uint64)callBackFn,
                                   (ScriptContext *)jsReentLock._24_8_);
              JsReentLock::MutateArrayObject((JsReentLock *)local_70);
              JsReentLock::relock((JsReentLock *)local_70);
              local_a1 = 1;
            }
          }
        }
        else {
          bVar6 = VarIsCorrectType<Js::TypedArrayBase>((TypedArrayBase *)obj_local);
          if (!bVar6) {
            bVar6 = VarIsCorrectType<Js::TypedArrayBase>((TypedArrayBase *)obj_local);
            if (!bVar6) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar12 = 1;
              bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                          ,0x277b,"(VarIsCorrectType(typedArrayBase))",
                                          "VarIsCorrectType(typedArrayBase)");
              if (!bVar6) {
                pcVar2 = (code *)invalidInstructionException();
                (*pcVar2)();
              }
              puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar12 = 0;
            }
            Throw::FatalInternalError(-0x7fffbffb);
          }
          uVar8 = ArrayObject::GetLength((ArrayObject *)obj_local);
          uStack_b0 = (ulong)uVar8;
          puVar14 = min<unsigned_long>((unsigned_long *)&args_local,&stack0xffffffffffffff50);
          local_a8 = (uint)*puVar14;
          for (; callBackFn < (RecyclableObject *)(ulong)local_a8 && (local_a1 & 1) == 0;
              callBackFn = (RecyclableObject *)
                           ((long)&(callBackFn->super_FinalizableObject).
                                   super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject + 1)) {
            iVar9 = (*(obj_local->super_FinalizableObject).super_IRecyclerVisitedObject.
                      _vptr_IRecyclerVisitedObject[0x72])(obj_local,(ulong)callBackFn & 0xffffffff);
            _end = (Var)CONCAT44(extraout_var,iVar9);
            local_a1 = 1;
            element = _end;
          }
        }
        if ((local_a1 & 1) == 0) {
          if (obj_local != (RecyclableObject *)0x0) {
            JavascriptError::ThrowTypeError
                      ((ScriptContext *)jsReentLock._24_8_,-0x7ff5ea0b,
                       L"TypedArray.prototype.reduce");
          }
          JavascriptError::ThrowTypeError
                    ((ScriptContext *)jsReentLock._24_8_,-0x7ff5ea0b,L"Array.prototype.reduce");
        }
      }
      else {
        element = Arguments::operator[](args,2);
      }
      if (element == (Var)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar12 = 1;
        bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                    ,0x27a2,"(accumulator)","accumulator");
        if (!bVar6) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar12 = 0;
      }
      this = ScriptContext::GetLibrary((ScriptContext *)jsReentLock._24_8_);
      pRVar13 = JavascriptLibraryBase::GetUndefined(&this->super_JavascriptLibraryBase);
      if (obj_local == (RecyclableObject *)0x0) {
        JsReentLock::unlock((JsReentLock *)local_70);
        pArr_local = (JavascriptArray *)
                     ReduceObjectHelper<unsigned_long>
                               ((RecyclableObject *)length_local,(unsigned_long)args_local,
                                (unsigned_long)callBackFn,(RecyclableObject *)accumulator,element,
                                (ScriptContext *)jsReentLock._24_8_);
      }
      else {
        bVar6 = VarIsCorrectType<Js::TypedArrayBase>((TypedArrayBase *)obj_local);
        if (!bVar6) {
          bVar6 = VarIsCorrectType<Js::TypedArrayBase>((TypedArrayBase *)obj_local);
          if (!bVar6) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar12 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                        ,0x27a8,"(VarIsCorrectType(typedArrayBase))",
                                        "VarIsCorrectType(typedArrayBase)");
            if (!bVar6) {
              pcVar2 = (code *)invalidInstructionException();
              (*pcVar2)();
            }
            puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar12 = 0;
          }
          Throw::FatalInternalError(-0x7fffbffb);
        }
        uVar8 = ArrayObject::GetLength((ArrayObject *)obj_local);
        autoReentrancyHandler._8_8_ = ZEXT48(uVar8);
        puVar14 = min<unsigned_long>((unsigned_long *)&args_local,
                                     (unsigned_long *)
                                     &autoReentrancyHandler.m_savedReentrancySafeOrHandled);
        uVar1 = *puVar14;
        for (; callBackFn < (RecyclableObject *)(uVar1 & 0xffffffff);
            callBackFn = (RecyclableObject *)
                         ((long)&(callBackFn->super_FinalizableObject).super_IRecyclerVisitedObject.
                                 _vptr_IRecyclerVisitedObject + 1)) {
          iVar9 = (*(obj_local->super_FinalizableObject).super_IRecyclerVisitedObject.
                    _vptr_IRecyclerVisitedObject[0x72])(obj_local,(ulong)callBackFn & 0xffffffff);
          _end = (Var)CONCAT44(extraout_var_00,iVar9);
          JsReentLock::unlock((JsReentLock *)local_70);
          pTVar10 = ScriptContext::GetThreadContext((ScriptContext *)jsReentLock._24_8_);
          AutoReentrancyHandler::AutoReentrancyHandler((AutoReentrancyHandler *)local_e0,pTVar10);
          pTVar10 = ScriptContext::GetThreadContext((ScriptContext *)jsReentLock._24_8_);
          ThreadContext::CheckAndResetReentrancySafeOrHandled(pTVar10);
          pTVar10 = ScriptContext::GetThreadContext((ScriptContext *)jsReentLock._24_8_);
          ThreadContext::AssertJsReentrancy(pTVar10);
          pvVar11 = accumulator;
          p_Var15 = RecyclableObject::GetEntryPoint((RecyclableObject *)accumulator);
          CheckIsExecutable((RecyclableObject *)pvVar11,p_Var15);
          p_Var15 = RecyclableObject::GetEntryPoint((RecyclableObject *)accumulator);
          pvVar4 = accumulator;
          CallInfo::CallInfo(&local_e8,CallFlags_Value,5);
          pvVar5 = accumulator;
          CallInfo::CallInfo(&local_f0,CallFlags_Value,5);
          pvVar3 = element;
          pvVar11 = _end;
          pvVar16 = JavascriptNumber::ToVar((uint64)callBackFn,(ScriptContext *)jsReentLock._24_8_);
          element = (*p_Var15)((RecyclableObject *)pvVar4,(CallInfo)pvVar5,local_e8,0,0,0,0,local_f0
                               ,pRVar13,pvVar3,pvVar11,pvVar16,obj_local);
          AutoReentrancyHandler::~AutoReentrancyHandler((AutoReentrancyHandler *)local_e0);
          JsReentLock::MutateArrayObject((JsReentLock *)local_70);
          JsReentLock::relock((JsReentLock *)local_70);
        }
        pArr_local = (JavascriptArray *)element;
      }
      JsReentLock::~JsReentLock((JsReentLock *)local_70);
      return pArr_local;
    }
  }
  if (obj_local != (RecyclableObject *)0x0) {
    JavascriptError::ThrowTypeError
              ((ScriptContext *)jsReentLock._24_8_,-0x7ff5ec34,L"[TypedArray].prototype.reduce");
  }
  JavascriptError::ThrowTypeError
            ((ScriptContext *)jsReentLock._24_8_,-0x7ff5ec34,L"Array.prototype.reduce");
}

Assistant:

Var JavascriptArray::ReduceHelper(JavascriptArray* pArr, Js::TypedArrayBase* typedArrayBase, RecyclableObject* obj, T length, Arguments& args, ScriptContext* scriptContext)
    {
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());
        SETOBJECT_FOR_MUTATION(jsReentLock, pArr);

        if (args.Info.Count < 2 || !JavascriptConversion::IsCallable(args[1]))
        {
            if (typedArrayBase != nullptr)
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedFunction, _u("[TypedArray].prototype.reduce"));
            }
            else
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedFunction, _u("Array.prototype.reduce"));
            }
        }

        // If we came from Array.prototype.reduce and source object is not a JavascriptArray, source could be a TypedArray
        if (typedArrayBase == nullptr && pArr == nullptr && VarIs<TypedArrayBase>(obj))
        {
            typedArrayBase = UnsafeVarTo<TypedArrayBase>(obj);
        }

        T k = 0;
        RecyclableObject* callBackFn = VarTo<RecyclableObject>(args[1]);
        Var accumulator = nullptr;
        Var element = nullptr;

        if (args.Info.Count > 2)
        {
            accumulator = args[2];
        }
        else
        {
            if (length == 0)
            {
                if (typedArrayBase)
                {
                    JavascriptError::ThrowTypeError(scriptContext, JSERR_EmptyArrayAndInitValueNotPresent, _u("TypedArray.prototype.reduce"));
                }
                else
                {
                    JavascriptError::ThrowTypeError(scriptContext, JSERR_EmptyArrayAndInitValueNotPresent, _u("Array.prototype.reduce"));
                }
            }

            bool bPresent = false;

            if (typedArrayBase)
            {
                AssertAndFailFast(VarIsCorrectType(typedArrayBase));
                uint32 end = (uint32)min(length, (T)typedArrayBase->GetLength());

                for (; k < end && bPresent == false; k++)
                {
                    // No need to do HasItem, as it cannot be observable unless 'typedArrayBase' is proxy. And we have established that it is indeed typedarray.

                    element = typedArrayBase->DirectGetItem((uint32)k);

                    bPresent = true;
                    accumulator = element;
                }
            }
            else
            {
                for (; k < length && bPresent == false; k++)
                {
                    JS_REENTRANT(jsReentLock, BOOL hasItem = JavascriptOperators::HasItem(obj, k));
                    if (hasItem)
                    {
                        JS_REENTRANT(jsReentLock, accumulator = JavascriptOperators::GetItem(obj, k, scriptContext));
                        bPresent = true;
                    }
                }
            }

            if (bPresent == false)
            {
                if (typedArrayBase)
                {
                    JavascriptError::ThrowTypeError(scriptContext, JSERR_EmptyArrayAndInitValueNotPresent, _u("TypedArray.prototype.reduce"));
                }
                else
                {
                    JavascriptError::ThrowTypeError(scriptContext, JSERR_EmptyArrayAndInitValueNotPresent, _u("Array.prototype.reduce"));
                }
            }
        }

        Assert(accumulator);

        Var undefinedValue = scriptContext->GetLibrary()->GetUndefined();

        if (typedArrayBase)
        {
            AssertAndFailFast(VarIsCorrectType(typedArrayBase));
            uint32 end = (uint32)min(length, (T)typedArrayBase->GetLength());

            for (; k < end; k++)
            {
                // No need to do HasItem, as it cannot be observable unless 'typedArrayBase' is proxy. And we have established that it is indeed typedarray.

                element = typedArrayBase->DirectGetItem((uint32)k);

                JS_REENTRANT(jsReentLock,
                    BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
                    {
                        accumulator = CALL_FUNCTION(scriptContext->GetThreadContext(), callBackFn, CallInfo(CallFlags_Value, 5), undefinedValue,
                                accumulator,
                                element,
                                JavascriptNumber::ToVar(k, scriptContext),
                                typedArrayBase);
                    }
                    END_SAFE_REENTRANT_CALL
                );
            }
        }
        else
        {
            JS_REENTRANT_UNLOCK(jsReentLock, return JavascriptArray::ReduceObjectHelper<T>(obj, length, k, callBackFn, accumulator, scriptContext));
        }

        return accumulator;
    }